

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void EndVisitCatch(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *pSVar1;
  FuncInfo *this;
  Utf8SourceInfo *pUVar2;
  ParseableFunctionInfo *pPVar3;
  code *pcVar4;
  bool bVar5;
  ParseNodeCatch *pPVar6;
  undefined4 *puVar7;
  
  pPVar6 = ParseNode::AsParseNodeCatch(pnode);
  pSVar1 = pPVar6->scope;
  if (pSVar1->innerScopeIndex != 0xffffffff) {
    this = pSVar1->func;
    pUVar2 = byteCodeGenerator->m_utf8SourceInfo;
    if ((((pUVar2->debugModeSource).ptr != (uchar *)0x0) || ((pUVar2->field_0xa8 & 0x20) != 0)) &&
       ((pUVar2->field_0xa8 & 0x40) != 0)) goto LAB_0082e04f;
    pPVar3 = this->byteCodeFunction;
    if ((pPVar3->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_0082e065;
      *puVar7 = 0;
    }
    if ((ParseableFunctionInfo *)
        (((pPVar3->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar5) goto LAB_0082e065;
      *puVar7 = 0;
    }
    if ((((pPVar3->super_FunctionProxy).functionInfo.ptr)->attributes & (Async|Generator)) == None)
    {
      if (pSVar1->innerScopeIndex != this->currentInnerScopeIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xa6,"(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex())",
                           "scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex()");
        if (!bVar5) {
LAB_0082e065:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      FuncInfo::ReleaseInnerScopeIndex(this);
    }
  }
LAB_0082e04f:
  ByteCodeGenerator::PopScope(byteCodeGenerator);
  return;
}

Assistant:

void EndVisitCatch(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    FuncInfo *func = scope->GetFunc();

    if (scope->HasInnerScopeIndex() && !(byteCodeGenerator->IsInDebugMode() || func->byteCodeFunction->IsCoroutine()))
    {
        // In debug mode (or for the generator/async function), don't release the current index, as we're giving each scope a unique index,
        // regardless of nesting.

        Assert(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex());
        func->ReleaseInnerScopeIndex();
    }

    byteCodeGenerator->PopScope();
}